

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL Js::JavascriptArray::GetIndex(char16 *propName,uint32 *pIndex)

{
  uint uVar1;
  size_t sVar2;
  char16 *local_38;
  char16 *pch;
  int32 cch;
  uint32 luDig;
  uint32 lu;
  uint32 *pIndex_local;
  char16 *propName_local;
  
  sVar2 = PAL_wcslen(propName);
  cch = (ushort)*propName - 0x30;
  if ((uint)cch < 10) {
    local_38 = propName;
    if (cch == 0) {
      *pIndex = 0;
      propName_local._4_4_ = (uint)((int)sVar2 == 1);
    }
    else {
      while( true ) {
        uVar1 = (ushort)local_38[1] - 0x30;
        if (9 < uVar1) break;
        if (0x19999999 < (uint)cch) {
          return 0;
        }
        if (0xffffffff - (ulong)uVar1 < (ulong)(uint)(cch * 10)) {
          return 0;
        }
        cch = uVar1 + cch * 10;
        local_38 = local_38 + 1;
      }
      if ((long)(local_38 + 1) - (long)propName >> 1 == (long)(int)sVar2) {
        if (cch == -1) {
          propName_local._4_4_ = 0;
        }
        else {
          *pIndex = cch;
          propName_local._4_4_ = 1;
        }
      }
      else {
        propName_local._4_4_ = 0;
      }
    }
  }
  else {
    propName_local._4_4_ = 0;
  }
  return propName_local._4_4_;
}

Assistant:

BOOL JavascriptArray::GetIndex(const char16* propName, uint32 *pIndex)
    {
        uint32 lu, luDig;

        int32 cch = (int32)wcslen(propName);
        char16* pch = const_cast<char16 *>(propName);

        lu = *pch - '0';
        if (lu > 9)
            return FALSE;

        if (0 == lu)
        {
            *pIndex = 0;
            return 1 == cch;
        }

        while ((luDig = *++pch - '0') < 10)
        {
            // If we overflow 32 bits, ignore the item
            if (lu > 0x19999999)
                return FALSE;
            lu *= 10;
            if(lu > (ULONG_MAX - luDig))
                return FALSE;
            lu += luDig;
        }

        if (pch - propName != cch)
            return FALSE;

        if (lu == JavascriptArray::InvalidIndex)
        {
            // 0xFFFFFFFF is not treated as an array index so that the length can be
            // capped at 32 bits.
            return FALSE;
        }

        *pIndex = lu;
        return TRUE;
    }